

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void on_cbs_open_complete(void *context,CBS_OPEN_COMPLETE_RESULT open_complete_result)

{
  CBS_OPEN_COMPLETE_RESULT open_complete_result_local;
  void *context_local;
  
  if (open_complete_result == CBS_OPEN_OK) {
    printf("CBS instance open.\r\n");
  }
  else {
    printf("CBS instance open failed.\r\n");
  }
  return;
}

Assistant:

static void on_cbs_open_complete(void* context, CBS_OPEN_COMPLETE_RESULT open_complete_result)
{
    (void)context;
    switch (open_complete_result)
    {
    default:
        (void)printf("CBS instance open failed.\r\n");
        break;

    case CBS_OPEN_OK:
        (void)printf("CBS instance open.\r\n");
        break;
    }
}